

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeGetNonlinearSystemData
              (void *arkode_mem,sunrealtype *tcur,N_Vector *zpred,N_Vector *z,N_Vector *Fi,
              sunrealtype *gamma,N_Vector *sdata,void **user_data)

{
  N_Vector *in_RCX;
  N_Vector *in_RDX;
  sunrealtype *in_RSI;
  ARKodeMem in_RDI;
  N_Vector *in_R8;
  sunrealtype *in_R9;
  N_Vector *in_stack_00000008;
  void **in_stack_00000010;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x9d6,"ARKodeGetNonlinearSystemData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x9df,"ARKodeGetNonlinearSystemData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not support algebraic solvers");
    local_4 = -0x30;
  }
  else if (in_RDI->step_getnonlinearsystemdata == (ARKTimestepGetNonlinearSystemData)0x0) {
    arkProcessError(in_RDI,-0x30,0x9ed,"ARKodeGetNonlinearSystemData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"time-stepping module does not support this function");
    local_4 = -0x30;
  }
  else {
    local_4 = (*in_RDI->step_getnonlinearsystemdata)
                        (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010
                        );
  }
  return local_4;
}

Assistant:

int ARKodeGetNonlinearSystemData(void* arkode_mem, sunrealtype* tcur,
                                 N_Vector* zpred, N_Vector* z, N_Vector* Fi,
                                 sunrealtype* gamma, N_Vector* sdata,
                                 void** user_data)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for incompatible time stepper modules */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support algebraic solvers");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine to compute the state (if provided) */
  if (ark_mem->step_getnonlinearsystemdata)
  {
    return (ark_mem->step_getnonlinearsystemdata(ark_mem, tcur, zpred, z, Fi,
                                                 gamma, sdata, user_data));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}